

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void * JS_GetOpaque(JSValue obj,JSClassID class_id)

{
  JSObject *p;
  JSClassID class_id_local;
  JSValue obj_local;
  undefined8 local_8;
  
  if ((int)obj.tag == -1) {
    if (*(ushort *)((long)obj.u.ptr + 6) == class_id) {
      local_8 = *(void **)((long)obj.u.ptr + 0x30);
    }
    else {
      local_8 = (void *)0x0;
    }
  }
  else {
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void *JS_GetOpaque(JSValueConst obj, JSClassID class_id)
{
    JSObject *p;
    if (JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT)
        return NULL;
    p = JS_VALUE_GET_OBJ(obj);
    if (p->class_id != class_id)
        return NULL;
    return p->u.opaque;
}